

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

void x86_cpuid_sublevel(int level,int sublevel,uint *out)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *out_local;
  int sublevel_local;
  int level_local;
  
  if (level == 0) {
    puVar1 = (uint *)cpuid_basic_info(0);
  }
  else if (level == 1) {
    puVar1 = (uint *)cpuid_Version_info(1);
  }
  else if (level == 2) {
    puVar1 = (uint *)cpuid_cache_tlb_info(2);
  }
  else if (level == 3) {
    puVar1 = (uint *)cpuid_serial_info(3);
  }
  else if (level == 4) {
    puVar1 = (uint *)cpuid_Deterministic_Cache_Parameters_info(4);
  }
  else if (level == 5) {
    puVar1 = (uint *)cpuid_MONITOR_MWAIT_Features_info(5);
  }
  else if (level == 6) {
    puVar1 = (uint *)cpuid_Thermal_Power_Management_info(6);
  }
  else if (level == 7) {
    puVar1 = (uint *)cpuid_Extended_Feature_Enumeration_info(7);
  }
  else if (level == 9) {
    puVar1 = (uint *)cpuid_Direct_Cache_Access_info(9);
  }
  else if (level == 10) {
    puVar1 = (uint *)cpuid_Architectural_Performance_Monitoring_info(10);
  }
  else if (level == 0xb) {
    puVar1 = (uint *)cpuid_Extended_Topology_info(0xb);
  }
  else if (level == 0xd) {
    puVar1 = (uint *)cpuid_Processor_Extended_States_info(0xd);
  }
  else if (level == 0xf) {
    puVar1 = (uint *)cpuid_Quality_of_Service_info(0xf);
  }
  else if (level == -0x7ffffffe) {
    puVar1 = (uint *)cpuid_brand_part1_info(0x80000002);
  }
  else if (level == -0x7ffffffd) {
    puVar1 = (uint *)cpuid_brand_part2_info(0x80000003);
  }
  else if (level == -0x7ffffffc) {
    puVar1 = (uint *)cpuid_brand_part3_info(0x80000004);
  }
  else {
    puVar1 = (uint *)cpuid(level);
  }
  uVar2 = puVar1[1];
  uVar3 = puVar1[2];
  uVar4 = puVar1[3];
  *out = *puVar1;
  out[1] = uVar2;
  out[2] = uVar4;
  out[3] = uVar3;
  return;
}

Assistant:

static inline void x86_cpuid_sublevel(int level, int sublevel, unsigned int out[4])
{
#if defined(_MSC_VER)
    __cpuidex((int*)out, level, sublevel);
#elif defined(__clang__) || defined(__GNUC__)
    __cpuid_count(level, sublevel, out[0], out[1], out[2], out[3]);
#else
    NCNN_LOGE("x86_cpuid_sublevel is unknown for current compiler");
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
#endif
}